

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O3

string * backward::TraceResolverLinuxBase::read_symlink
                   (string *__return_storage_ptr__,string *symlink_path)

{
  size_type sVar1;
  _Alloc_hider local_40;
  size_t local_38;
  char local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  
  local_38 = 0;
  local_30 = '\0';
  local_40._M_p = &local_30;
  std::__cxx11::string::resize((ulong)&local_40,'d');
  while( true ) {
    sVar1 = readlink((symlink_path->_M_dataplus)._M_p,local_40._M_p,local_38);
    if ((long)sVar1 < 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      if (local_40._M_p != &local_30) {
        operator_delete(local_40._M_p);
      }
      return __return_storage_ptr__;
    }
    if (sVar1 != local_38) break;
    std::__cxx11::string::resize((ulong)&local_40,(char)sVar1 * '\x02');
  }
  std::__cxx11::string::resize((ulong)&local_40,(char)sVar1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_40._M_p == &local_30) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_2f,local_30);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_28;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_40._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_2f,local_30);
  }
  __return_storage_ptr__->_M_string_length = local_38;
  return __return_storage_ptr__;
}

Assistant:

static std::string read_symlink(std::string const &symlink_path) {
    std::string path;
    path.resize(100);

    while (true) {
      ssize_t len =
          ::readlink(symlink_path.c_str(), &*path.begin(), path.size());
      if (len < 0) {
        return "";
      }
      if (static_cast<size_t>(len) == path.size()) {
        path.resize(path.size() * 2);
      } else {
        path.resize(static_cast<std::string::size_type>(len));
        break;
      }
    }

    return path;
  }